

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O0

string * __thiscall
iqxmlrpc::Value::get_string_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Value *this_local;
  
  this_00 = cast<iqxmlrpc::Scalar<std::__cxx11::string>>(this);
  pbVar1 = Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::value(this_00);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Value::get_string() const
{
  return cast<String>()->value();
}